

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

string * __thiscall
BmsParseInvalidCharAsHeaderOrBarException::Message_abi_cxx11_
          (string *__return_storage_ptr__,BmsParseInvalidCharAsHeaderOrBarException *this)

{
  ostream *poVar1;
  stringstream os;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,anon_var_dwarf_33b88);
  std::operator<<(poVar1,(string *)&(this->super_BmsParseInvalidCharException).str_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsParseInvalidCharAsHeaderOrBarException::Message( void ) const
{
  std::stringstream os;
  os << "ヘッダ名または小節番号として不正な文字が指定されました。文字列 : " << this->GetString();
  return os.str();
}